

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  UdpSocketTest *this;
  TcpSocketTest *this_00;
  TestRunner runner;
  TestCase *test_set [10];
  TestRunner local_69;
  UdpSocketTest *local_68;
  TcpSocketTest *local_60;
  
  TestRunner::TestRunner(&local_69,*argv);
  this = (UdpSocketTest *)
         operator_new(0x130,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                      ,0x2d2);
  UdpSocketTest::UdpSocketTest(this);
  local_68 = this;
  this_00 = (TcpSocketTest *)
            operator_new(0x138,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                         ,0x2d3);
  TcpSocketTest::TcpSocketTest(this_00);
  local_60 = this_00;
  TestRunner::RunAll(&local_69,(TestCase **)&local_68,2);
  return 0;
}

Assistant:

int main( int argc, char*argv[] )
{	
	TestRunner runner( argv[ 0 ] );

	TestCase *test_set[ 10 ];
	
	test_set[ 0 ] = jh_new UdpSocketTest();
	test_set[ 1 ] = jh_new TcpSocketTest();
	
	runner.RunAll( test_set, 2 );

	return 0;
}